

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ObjMergeOrder(Mf_Man_t *p,int iObj)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint nCutNum;
  undefined8 uVar5;
  undefined8 uVar6;
  Mf_Cut_t *pCut;
  Vec_Mem_t *pVVar7;
  ulong uVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  float fVar15;
  int w;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint nCuts;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  Gia_Obj_t *pObj;
  Mf_Obj_t *pMVar24;
  Gia_Obj_t *pGVar25;
  word *pwVar26;
  word wVar27;
  word wVar28;
  word wVar29;
  word *pwVar30;
  word *pIn;
  long lVar31;
  ulong uVar32;
  void *pvVar33;
  uint *puVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  int *piVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  Mf_Cut_t *pMVar43;
  long lVar44;
  Gia_Man_t *p_00;
  uint uVar45;
  Mf_Cut_t *pMVar46;
  uint uVar47;
  Mf_Cut_t *pMVar48;
  int iVar49;
  int iVar50;
  int *piVar51;
  int iVar52;
  bool bVar53;
  word uTruth [16];
  Mf_Cut_t *pCutsR [16];
  word uTruth0 [16];
  word local_1138 [16];
  word uTruth1 [16];
  Mf_Cut_t pCuts2 [16];
  Mf_Cut_t pCuts0 [16];
  Mf_Cut_t pCuts1 [16];
  Mf_Cut_t pCuts [16];
  
  pObj = Gia_ManObj(p->pGia,iObj);
  pMVar24 = p->pLfObjs + iObj;
  uVar40 = p->pPars->nLutSize;
  uVar32 = (ulong)uVar40;
  nCutNum = p->pPars->nCutNum;
  iVar16 = Mf_ManPrepareCuts(pCuts0,p,iObj - (*(uint *)pObj & 0x1fffffff),1);
  iVar37 = 1;
  iVar17 = Mf_ManPrepareCuts(pCuts1,p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),1);
  p_00 = p->pGia;
  piVar51 = p_00->pSibls;
  uVar35 = 0;
  iVar18 = 0;
  if (piVar51 != (int *)0x0) {
    iVar18 = piVar51[iObj];
  }
  uVar4 = (uint)(*(ulong *)pObj >> 0x1d) & 1;
  uVar36 = (uint)(*(ulong *)pObj >> 0x3d) & 1;
  uVar38 = 0;
  if (0 < (int)nCutNum) {
    uVar38 = (ulong)nCutNum;
  }
  pMVar43 = pCuts;
  for (; uVar38 != uVar35; uVar35 = uVar35 + 1) {
    pCutsR[uVar35] = pMVar43;
    pMVar43 = pMVar43 + 1;
  }
  if (iVar18 == 0) {
    nCuts = 0;
  }
  else {
    pGVar25 = Gia_ManObj(p_00,piVar51[iObj]);
    uVar5 = *(undefined8 *)pGVar25;
    uVar6 = *(undefined8 *)pObj;
    pMVar43 = pCuts2;
    nCuts = 0;
    iVar18 = Mf_ManPrepareCuts(pMVar43,p,iVar18,0);
    for (; pMVar43 < pCuts2 + iVar18; pMVar43 = pMVar43 + 1) {
      pMVar46 = pCutsR[(int)nCuts];
      wVar27 = pMVar43->Sign;
      iVar22 = pMVar43->Delay;
      fVar15 = pMVar43->Flow;
      iVar42 = pMVar43->pLeaves[0];
      uVar10 = *(undefined8 *)(pMVar43->pLeaves + 1);
      uVar11 = *(undefined8 *)(pMVar43->pLeaves + 3);
      uVar12 = *(undefined8 *)(pMVar43->pLeaves + 5);
      uVar13 = *(undefined8 *)(pMVar43->pLeaves + 7);
      uVar14 = *(undefined8 *)(pMVar43->pLeaves + 9);
      *(undefined4 *)&pMVar46->field_0x10 = *(undefined4 *)&pMVar43->field_0x10;
      pMVar46->pLeaves[0] = iVar42;
      *(undefined8 *)(pMVar46->pLeaves + 1) = uVar10;
      *(undefined8 *)(pMVar46->pLeaves + 7) = uVar13;
      *(undefined8 *)(pMVar46->pLeaves + 9) = uVar14;
      *(undefined8 *)(pMVar46->pLeaves + 3) = uVar11;
      *(undefined8 *)(pMVar46->pLeaves + 5) = uVar12;
      pMVar46->Sign = wVar27;
      pMVar46->Delay = iVar22;
      pMVar46->Flow = fVar15;
      uVar19 = Abc_LitNotCond(*(uint *)&pMVar46->field_0x10 & 0x7ffffff,
                              ((uint)((ulong)uVar5 >> 0x20) ^ (uint)((ulong)uVar6 >> 0x20)) >> 0x1f)
      ;
      *(uint *)&pMVar46->field_0x10 =
           *(uint *)&pMVar46->field_0x10 & 0xf8000000 | uVar19 & 0x7ffffff;
      Mf_CutParams(p,pMVar46,pMVar24->nFlowRefs);
      nCuts = Mf_SetAddCut(pCutsR,nCuts,nCutNum);
    }
    p_00 = p->pGia;
  }
  if ((p_00->pMuxes == (uint *)0x0) || (p_00->pMuxes[iObj] == 0)) {
    iVar18 = Gia_ObjIsXor(pObj);
    p->CutCount[0] = (double)(iVar17 * iVar16) + p->CutCount[0];
    piVar51 = pCuts0[0].pLeaves;
    for (pMVar43 = pCuts0; pMVar43 < pCuts0 + iVar16; pMVar43 = pMVar43 + 1) {
      for (pMVar46 = pCuts1; pMVar46 < pCuts1 + iVar17; pMVar46 = pMVar46 + 1) {
        uVar19 = *(uint *)&pMVar43->field_0x10;
        uVar20 = uVar19 >> 0x1b;
        uVar23 = *(uint *)&pMVar46->field_0x10;
        uVar21 = uVar23 >> 0x1b;
        if (((int)uVar40 < (int)(uVar21 + uVar20)) &&
           (uVar35 = pMVar46->Sign | pMVar43->Sign,
           uVar35 = uVar35 - (uVar35 >> 1 & 0x5555555555555555),
           uVar35 = (uVar35 >> 2 & 0x3333333333333333) + (uVar35 & 0x3333333333333333),
           (int)uVar40 <
           (int)(uint)(byte)(((uVar35 >> 4) + uVar35 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38))) goto LAB_005f7453;
        p->CutCount[1] = p->CutCount[1] + 1.0;
        pMVar48 = pCutsR[(int)nCuts];
        piVar1 = pMVar46->pLeaves;
        piVar2 = pMVar48->pLeaves;
        if ((uVar20 == uVar40) && (uVar21 == uVar40)) {
          for (uVar35 = 0; uVar45 = uVar40, uVar32 != uVar35; uVar35 = uVar35 + 1) {
            if (piVar51[uVar35] != pMVar46->pLeaves[uVar35]) goto LAB_005f7453;
            piVar2[uVar35] = piVar51[uVar35];
          }
LAB_005f741b:
          *(uint *)&pMVar48->field_0x10 = uVar45 << 0x1b | 0x7ffffff;
          pMVar48->Sign = pMVar46->Sign | pMVar43->Sign;
          iVar42 = Mf_SetLastCutIsContained(pCutsR,nCuts);
          if (iVar42 == 0) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if (p->pPars->fCutMin != 0) {
              iVar42 = p->pPars->nLutSize;
              if (iVar42 < 7) {
                uVar19 = *(uint *)&pMVar48->field_0x10;
                pVVar7 = p->vTtMem;
                iVar42 = Abc_Lit2Var(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                pwVar26 = Vec_MemReadEntry(pVVar7,iVar42);
                uVar35 = *pwVar26;
                pVVar7 = p->vTtMem;
                iVar42 = Abc_Lit2Var(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                pwVar26 = Vec_MemReadEntry(pVVar7,iVar42);
                uVar38 = *pwVar26;
                uVar23 = Abc_LitIsCompl(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                uVar20 = Abc_LitIsCompl(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                wVar27 = Abc_Tt6Expand(-(ulong)(uVar23 != uVar4) ^ uVar35,pMVar43->pLeaves,
                                       *(uint *)&pMVar43->field_0x10 >> 0x1b,piVar2,
                                       *(uint *)&pMVar48->field_0x10 >> 0x1b);
                wVar28 = Abc_Tt6Expand(-(ulong)(uVar20 != uVar36) ^ uVar38,piVar1,
                                       *(uint *)&pMVar46->field_0x10 >> 0x1b,piVar2,
                                       *(uint *)&pMVar48->field_0x10 >> 0x1b);
                uVar35 = wVar28 & wVar27;
                if (iVar18 != 0) {
                  uVar35 = wVar28 ^ wVar27;
                }
                uVar23 = (uint)uVar35 & 1;
                pCuts2[0].Sign = -(ulong)uVar23 ^ uVar35;
                if (p->pPars->fCnfObjIds == 0) {
                  iVar42 = Abc_Tt6MinBase(&pCuts2[0].Sign,piVar2,
                                          *(uint *)&pMVar48->field_0x10 >> 0x1b);
                  *(uint *)&pMVar48->field_0x10 =
                       *(uint *)&pMVar48->field_0x10 & 0x7ffffff | iVar42 << 0x1b;
                }
                wVar27 = pCuts2[0].Sign;
                if ((pCuts2[0].Sign & 1) != 0) {
                  __assert_fail("(int)(t & 1) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                ,0x22d,
                                "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                               );
                }
                iVar42 = Vec_MemHashInsert(p->vTtMem,&pCuts2[0].Sign);
                uVar20 = Abc_Var2Lit(iVar42,uVar23);
                uVar23 = *(uint *)&pMVar48->field_0x10;
                uVar20 = uVar23 & 0xf8000000 | uVar20 & 0x7ffffff;
                *(uint *)&pMVar48->field_0x10 = uVar20;
                if ((p->pPars->fGenCnf != 0) && (iVar42 == (p->vCnfSizes).nSize)) {
                  iVar42 = Abc_Tt6CnfSize(wVar27,uVar23 >> 0x1b);
                  Vec_IntPush(&p->vCnfSizes,iVar42);
                  uVar20 = *(uint *)&pMVar48->field_0x10;
                }
                uVar19 = uVar19 >> 0x1b;
                bVar53 = uVar20 >> 0x1b < uVar19;
                if (!bVar53 && uVar20 >> 0x1b != uVar19) {
                  __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                ,0x233,
                                "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                               );
                }
              }
              else {
                bVar9 = (char)iVar42 - 6U & 0x1f;
                uVar23 = 1 << bVar9;
                uVar19 = *(uint *)&pMVar48->field_0x10;
                pVVar7 = p->vTtMem;
                iVar22 = Abc_Lit2Var(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                pwVar26 = Vec_MemReadEntry(pVVar7,iVar22);
                pVVar7 = p->vTtMem;
                iVar22 = Abc_Lit2Var(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                pwVar30 = Vec_MemReadEntry(pVVar7,iVar22);
                uVar20 = Abc_LitIsCompl(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                Abc_TtCopy(uTruth,pwVar26,uVar23,uVar20 ^ uVar4);
                uVar20 = Abc_LitIsCompl(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                Abc_TtCopy(uTruth0,pwVar30,uVar23,uVar20 ^ uVar36);
                Abc_TtExpand(uTruth,iVar42,pMVar43->pLeaves,*(uint *)&pMVar43->field_0x10 >> 0x1b,
                             piVar2,*(uint *)&pMVar48->field_0x10 >> 0x1b);
                Abc_TtExpand(uTruth0,iVar42,piVar1,*(uint *)&pMVar46->field_0x10 >> 0x1b,piVar2,
                             *(uint *)&pMVar48->field_0x10 >> 0x1b);
                if (1 << bVar9 < 1) {
                  uVar23 = 0;
                }
                uVar35 = (ulong)uVar23;
                if (iVar18 == 0) {
                  uVar38 = 0;
                  uVar23 = (uint)uTruth0[0] & (uint)uTruth[0] & 1;
                  if (uVar23 == 0) {
                    for (; uVar35 != uVar38; uVar38 = uVar38 + 1) {
                      *(word *)(pCuts2[0].pLeaves + uVar38 * 2 + -5) =
                           uTruth0[uVar38] & uTruth[uVar38];
                    }
                    goto LAB_005f7903;
                  }
                  for (; uVar35 != uVar38; uVar38 = uVar38 + 1) {
                    *(word *)(pCuts2[0].pLeaves + uVar38 * 2 + -5) =
                         ~(uTruth0[uVar38] & uTruth[uVar38]);
                  }
                }
                else {
                  uVar38 = 0;
                  uVar23 = ((uint)uTruth0[0] ^ (uint)uTruth[0]) & 1;
                  if (uVar23 == 0) {
                    for (; uVar35 != uVar38; uVar38 = uVar38 + 1) {
                      *(word *)(pCuts2[0].pLeaves + uVar38 * 2 + -5) =
                           uTruth0[uVar38] ^ uTruth[uVar38];
                    }
LAB_005f7903:
                    uVar23 = 0;
                  }
                  else {
                    for (; uVar35 != uVar38; uVar38 = uVar38 + 1) {
                      *(word *)(pCuts2[0].pLeaves + uVar38 * 2 + -5) =
                           ~(uTruth[uVar38] ^ uTruth0[uVar38]);
                    }
                  }
                }
                iVar22 = Abc_TtMinBase(&pCuts2[0].Sign,piVar2,*(uint *)&pMVar48->field_0x10 >> 0x1b,
                                       iVar42);
                *(uint *)&pMVar48->field_0x10 =
                     *(uint *)&pMVar48->field_0x10 & 0x7ffffff | iVar22 << 0x1b;
                if ((pCuts2[0].Sign & 1) != 0) {
                  __assert_fail("(uTruth[0] & 1) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                ,0x24b,
                                "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                               );
                }
                iVar22 = Vec_MemHashInsert(p->vTtMem,&pCuts2[0].Sign);
                uVar20 = Abc_Var2Lit(iVar22,uVar23);
                uVar23 = *(uint *)&pMVar48->field_0x10;
                uVar20 = uVar23 & 0xf8000000 | uVar20 & 0x7ffffff;
                *(uint *)&pMVar48->field_0x10 = uVar20;
                if (((p->pPars->fGenCnf != 0) && (iVar42 < 9)) && (iVar22 == (p->vCnfSizes).nSize))
                {
                  iVar42 = Abc_Tt8CnfSize(&pCuts2[0].Sign,uVar23 >> 0x1b);
                  Vec_IntPush(&p->vCnfSizes,iVar42);
                  uVar20 = *(uint *)&pMVar48->field_0x10;
                }
                uVar19 = uVar19 >> 0x1b;
                bVar53 = uVar20 >> 0x1b < uVar19;
                if (!bVar53 && uVar20 >> 0x1b != uVar19) {
                  __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                ,0x251,
                                "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                               );
                }
              }
              if (bVar53) {
                wVar27 = Mf_CutGetSign(piVar2,*(uint *)&pMVar48->field_0x10 >> 0x1b);
                pMVar48->Sign = wVar27;
              }
            }
            Mf_CutParams(p,pMVar48,pMVar24->nFlowRefs);
            nCuts = Mf_SetAddCut(pCutsR,nCuts,nCutNum);
          }
        }
        else {
          iVar42 = 0;
          uVar45 = 0;
          if (uVar19 < 0x8000000) {
LAB_005f7397:
            if ((int)(uVar45 + uVar21) <= (int)(iVar42 + uVar40)) {
              piVar39 = pMVar48->pLeaves + (int)uVar45;
              for (lVar31 = (long)iVar42; lVar31 < (long)(ulong)uVar21; lVar31 = lVar31 + 1) {
                *piVar39 = pMVar46->pLeaves[lVar31];
                uVar45 = uVar45 + 1;
                piVar39 = piVar39 + 1;
              }
              goto LAB_005f741b;
            }
          }
          else {
            iVar22 = 0;
            uVar45 = 0;
            if (0x7ffffff < uVar23) {
              iVar42 = 0;
              uVar35 = 0;
              lVar31 = 0;
              do {
                while( true ) {
                  iVar22 = (int)uVar35;
                  lVar44 = 0;
                  while( true ) {
                    if (uVar32 - lVar31 == lVar44) goto LAB_005f7453;
                    iVar41 = piVar51[iVar22 + lVar44];
                    iVar50 = piVar1[iVar42];
                    iVar49 = (int)lVar44;
                    iVar52 = (int)lVar31;
                    if (iVar50 <= iVar41) break;
                    piVar2[lVar31 + lVar44] = iVar41;
                    lVar44 = lVar44 + 1;
                    if ((int)uVar20 <= (int)lVar44 + iVar22) goto LAB_005f774a;
                  }
                  lVar3 = lVar31 + 1 + lVar44;
                  if (iVar41 <= iVar50) break;
                  iVar42 = iVar42 + 1;
                  piVar2[lVar31 + lVar44] = iVar50;
                  if ((int)uVar21 <= iVar42) {
                    iVar22 = iVar22 + iVar49;
                    goto LAB_005f7ac5;
                  }
                  uVar35 = (ulong)(uint)(iVar22 + iVar49);
                  lVar31 = lVar3;
                }
                uVar35 = (uVar35 & 0xffffffff) + lVar44 + 1;
                piVar2[lVar31 + lVar44] = iVar41;
                iVar42 = iVar42 + 1;
                if ((int)uVar20 <= (int)uVar35) {
LAB_005f774a:
                  uVar45 = iVar52 + iVar49 + 1;
                  goto LAB_005f7397;
                }
                lVar31 = lVar3;
              } while (iVar42 < (int)uVar21);
              iVar22 = iVar22 + iVar49 + 1;
LAB_005f7ac5:
              uVar45 = iVar52 + iVar49 + 1;
            }
            if ((int)(uVar45 + uVar20) <= (int)(iVar22 + uVar40)) {
              piVar39 = pMVar48->pLeaves + (int)uVar45;
              for (lVar31 = (long)iVar22; lVar31 < (long)(ulong)uVar20; lVar31 = lVar31 + 1) {
                *piVar39 = piVar51[lVar31];
                uVar45 = uVar45 + 1;
                piVar39 = piVar39 + 1;
              }
              goto LAB_005f741b;
            }
          }
        }
LAB_005f7453:
      }
      piVar51 = piVar51 + 0x10;
    }
  }
  else {
    iVar18 = Gia_ObjFaninId2(p_00,iObj);
    iVar18 = Mf_ManPrepareCuts(pCuts2,p,iVar18,1);
    uVar19 = Gia_ObjFaninC2(p->pGia,pObj);
    p->CutCount[0] = (double)(iVar18 * iVar17 * iVar16) + p->CutCount[0];
    for (pMVar43 = pCuts0; pMVar43 < pCuts0 + iVar16; pMVar43 = pMVar43 + 1) {
      piVar51 = pMVar43->pLeaves;
      for (pMVar46 = pCuts1; pMVar46 < pCuts1 + iVar17; pMVar46 = pMVar46 + 1) {
        piVar1 = pMVar46->pLeaves;
        for (pMVar48 = pCuts2; pMVar48 < pCuts2 + iVar18; pMVar48 = pMVar48 + 1) {
          uVar35 = pMVar46->Sign | pMVar43->Sign | pMVar48->Sign;
          uVar35 = uVar35 - (uVar35 >> 1 & 0x5555555555555555);
          uVar35 = (uVar35 >> 2 & 0x3333333333333333) + (uVar35 & 0x3333333333333333);
          if ((int)(uint)(byte)(((uVar35 >> 4) + uVar35 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) <= (int)uVar40) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            pCut = pCutsR[(int)nCuts];
            uVar23 = *(uint *)&pMVar43->field_0x10;
            uVar20 = *(uint *)&pMVar46->field_0x10;
            uVar21 = *(uint *)&pMVar48->field_0x10;
            piVar2 = pMVar48->pLeaves;
            piVar39 = pCut->pLeaves;
            uVar35 = 0;
            iVar42 = 0x7ffffff;
            uVar45 = 0;
            uVar47 = 0;
            uVar38 = 0;
            while( true ) {
              iVar41 = 1000000000;
              iVar22 = 1000000000;
              if ((uint)uVar38 != uVar23 >> 0x1b) {
                iVar22 = piVar51[uVar38];
              }
              if (uVar47 != uVar20 >> 0x1b) {
                iVar41 = piVar1[uVar47];
              }
              iVar50 = 1000000000;
              if (uVar45 != uVar21 >> 0x1b) {
                iVar50 = piVar2[uVar45];
              }
              iVar49 = iVar41;
              if (iVar22 < iVar41) {
                iVar49 = iVar22;
              }
              iVar52 = iVar50;
              if (iVar49 < iVar50) {
                iVar52 = iVar49;
              }
              if (iVar52 == 1000000000) break;
              if (uVar32 == uVar35) goto LAB_005f721d;
              pCut->pLeaves[uVar35] = iVar52;
              uVar35 = uVar35 + 1;
              uVar38 = (ulong)((uint)uVar38 + (uint)(iVar22 == iVar52));
              uVar47 = uVar47 + (iVar41 == iVar52);
              uVar45 = uVar45 + (iVar50 <= iVar49);
              iVar42 = iVar42 + 0x8000000;
            }
            *(int *)&pCut->field_0x10 = iVar42;
            pCut->Sign = pMVar46->Sign | pMVar43->Sign | pMVar48->Sign;
            iVar42 = Mf_SetLastCutIsContained(pCutsR,nCuts);
            if (iVar42 == 0) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if (p->pPars->fCutMin != 0) {
                iVar42 = p->pPars->nLutSize;
                if (iVar42 < 7) {
                  uVar23 = *(uint *)&pCut->field_0x10;
                  pVVar7 = p->vTtMem;
                  iVar42 = Abc_Lit2Var(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                  pwVar26 = Vec_MemReadEntry(pVVar7,iVar42);
                  uVar35 = *pwVar26;
                  pVVar7 = p->vTtMem;
                  iVar42 = Abc_Lit2Var(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                  pwVar26 = Vec_MemReadEntry(pVVar7,iVar42);
                  uVar38 = *pwVar26;
                  pVVar7 = p->vTtMem;
                  iVar42 = Abc_Lit2Var(*(uint *)&pMVar48->field_0x10 & 0x7ffffff);
                  pwVar26 = Vec_MemReadEntry(pVVar7,iVar42);
                  uVar8 = *pwVar26;
                  uVar20 = Abc_LitIsCompl(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                  uVar21 = Abc_LitIsCompl(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                  uVar45 = Abc_LitIsCompl(*(uint *)&pMVar48->field_0x10 & 0x7ffffff);
                  wVar27 = Abc_Tt6Expand(-(ulong)(uVar20 != uVar4) ^ uVar35,piVar51,
                                         *(uint *)&pMVar43->field_0x10 >> 0x1b,piVar39,
                                         *(uint *)&pCut->field_0x10 >> 0x1b);
                  wVar28 = Abc_Tt6Expand(-(ulong)(uVar21 != uVar36) ^ uVar38,piVar1,
                                         *(uint *)&pMVar46->field_0x10 >> 0x1b,piVar39,
                                         *(uint *)&pCut->field_0x10 >> 0x1b);
                  wVar29 = Abc_Tt6Expand(-(ulong)(uVar45 != uVar19) ^ uVar8,piVar2,
                                         *(uint *)&pMVar48->field_0x10 >> 0x1b,piVar39,
                                         *(uint *)&pCut->field_0x10 >> 0x1b);
                  uVar35 = (wVar28 ^ wVar27) & wVar29 ^ wVar27;
                  uVar20 = (uint)uVar35;
                  uTruth[0] = -(ulong)(uVar20 & 1) ^ uVar35;
                  iVar42 = Abc_Tt6MinBase(uTruth,piVar39,*(uint *)&pCut->field_0x10 >> 0x1b);
                  wVar27 = uTruth[0];
                  *(uint *)&pCut->field_0x10 =
                       *(uint *)&pCut->field_0x10 & 0x7ffffff | iVar42 << 0x1b;
                  if ((uTruth[0] & 1) != 0) {
                    __assert_fail("(int)(t & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                  ,0x264,
                                  "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                 );
                  }
                  iVar42 = Vec_MemHashInsert(p->vTtMem,uTruth);
                  uVar21 = Abc_Var2Lit(iVar42,uVar20 & 1);
                  uVar20 = *(uint *)&pCut->field_0x10;
                  uVar21 = uVar20 & 0xf8000000 | uVar21 & 0x7ffffff;
                  *(uint *)&pCut->field_0x10 = uVar21;
                  if ((p->pPars->fGenCnf != 0) && (iVar42 == (p->vCnfSizes).nSize)) {
                    iVar42 = Abc_Tt6CnfSize(wVar27,uVar20 >> 0x1b);
                    Vec_IntPush(&p->vCnfSizes,iVar42);
                    uVar21 = *(uint *)&pCut->field_0x10;
                  }
                  uVar23 = uVar23 >> 0x1b;
                  bVar53 = uVar21 >> 0x1b < uVar23;
                  if (!bVar53 && uVar21 >> 0x1b != uVar23) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                  ,0x269,
                                  "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                 );
                  }
                }
                else {
                  bVar9 = (char)iVar42 - 6U & 0x1f;
                  uVar20 = 1 << bVar9;
                  uVar23 = *(uint *)&pCut->field_0x10;
                  pVVar7 = p->vTtMem;
                  iVar22 = Abc_Lit2Var(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                  pwVar26 = Vec_MemReadEntry(pVVar7,iVar22);
                  pVVar7 = p->vTtMem;
                  iVar22 = Abc_Lit2Var(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                  pwVar30 = Vec_MemReadEntry(pVVar7,iVar22);
                  pVVar7 = p->vTtMem;
                  iVar22 = Abc_Lit2Var(*(uint *)&pMVar48->field_0x10 & 0x7ffffff);
                  pIn = Vec_MemReadEntry(pVVar7,iVar22);
                  uVar21 = Abc_LitIsCompl(*(uint *)&pMVar43->field_0x10 & 0x7ffffff);
                  Abc_TtCopy(uTruth0,pwVar26,uVar20,uVar21 ^ uVar4);
                  uVar21 = Abc_LitIsCompl(*(uint *)&pMVar46->field_0x10 & 0x7ffffff);
                  Abc_TtCopy(uTruth1,pwVar30,uVar20,uVar21 ^ uVar36);
                  uVar21 = Abc_LitIsCompl(*(uint *)&pMVar48->field_0x10 & 0x7ffffff);
                  Abc_TtCopy(local_1138,pIn,uVar20,uVar21 ^ uVar19);
                  Abc_TtExpand(uTruth0,iVar42,piVar51,*(uint *)&pMVar43->field_0x10 >> 0x1b,piVar39,
                               *(uint *)&pCut->field_0x10 >> 0x1b);
                  Abc_TtExpand(uTruth1,iVar42,piVar1,*(uint *)&pMVar46->field_0x10 >> 0x1b,piVar39,
                               *(uint *)&pCut->field_0x10 >> 0x1b);
                  Abc_TtExpand(local_1138,iVar42,piVar2,*(uint *)&pMVar48->field_0x10 >> 0x1b,
                               piVar39,*(uint *)&pCut->field_0x10 >> 0x1b);
                  if (1 << bVar9 < 1) {
                    uVar20 = 0;
                  }
                  for (uVar35 = 0; uVar20 != uVar35; uVar35 = uVar35 + 1) {
                    uTruth[uVar35] =
                         (uTruth1[uVar35] ^ uTruth0[uVar35]) & local_1138[uVar35] ^ uTruth0[uVar35];
                  }
                  uVar21 = (uint)uTruth[0] & 1;
                  if ((uTruth[0] & 1) != 0) {
                    for (uVar35 = 0; uVar20 != uVar35; uVar35 = uVar35 + 1) {
                      uTruth[uVar35] = ~uTruth[uVar35];
                    }
                  }
                  iVar22 = Abc_TtMinBase(uTruth,piVar39,*(uint *)&pCut->field_0x10 >> 0x1b,iVar42);
                  *(uint *)&pCut->field_0x10 =
                       *(uint *)&pCut->field_0x10 & 0x7ffffff | iVar22 << 0x1b;
                  if ((uTruth[0] & 1) != 0) {
                    __assert_fail("(uTruth[0] & 1) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                  ,0x282,
                                  "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                 );
                  }
                  iVar22 = Vec_MemHashInsert(p->vTtMem,uTruth);
                  uVar21 = Abc_Var2Lit(iVar22,uVar21);
                  uVar20 = *(uint *)&pCut->field_0x10;
                  uVar21 = uVar20 & 0xf8000000 | uVar21 & 0x7ffffff;
                  *(uint *)&pCut->field_0x10 = uVar21;
                  if (((p->pPars->fGenCnf != 0) && (iVar42 < 9)) && (iVar22 == (p->vCnfSizes).nSize)
                     ) {
                    iVar42 = Abc_Tt8CnfSize(uTruth,uVar20 >> 0x1b);
                    Vec_IntPush(&p->vCnfSizes,iVar42);
                    uVar21 = *(uint *)&pCut->field_0x10;
                  }
                  uVar23 = uVar23 >> 0x1b;
                  bVar53 = uVar21 >> 0x1b < uVar23;
                  if (!bVar53 && uVar21 >> 0x1b != uVar23) {
                    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                  ,0x287,
                                  "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                 );
                  }
                }
                if (bVar53) {
                  wVar27 = Mf_CutGetSign(piVar39,*(uint *)&pCut->field_0x10 >> 0x1b);
                  pCut->Sign = wVar27;
                }
              }
              Mf_CutParams(p,pCut,pMVar24->nFlowRefs);
              nCuts = Mf_SetAddCut(pCutsR,nCuts,nCutNum);
            }
          }
LAB_005f721d:
        }
      }
    }
  }
  pMVar24->Flow = pCutsR[0]->Flow;
  *(short *)&pMVar24->field_0xc = (short)pCutsR[0]->Delay;
  uVar32 = 0;
  uVar35 = 0;
  if (0 < (int)nCuts) {
    uVar35 = (ulong)nCuts;
  }
  for (; uVar35 != uVar32; uVar32 = uVar32 + 1) {
    iVar37 = iVar37 + (*(uint *)&pCutsR[uVar32]->field_0x10 >> 0x1b) + 1;
  }
  uVar40 = p->iCur;
  if (0xffff < (uVar40 & 0xffff) + iVar37) {
    uVar40 = (uVar40 & 0xffff0000) + 0x10000;
    p->iCur = uVar40;
  }
  iVar18 = (p->vPages).nSize;
  if (iVar18 == (int)uVar40 >> 0x10) {
    pvVar33 = malloc(0x40000);
    if (iVar18 == (p->vPages).nCap) {
      iVar16 = 0x10;
      if (0xf < iVar18) {
        iVar16 = iVar18 * 2;
      }
      Vec_PtrGrow(&p->vPages,iVar16);
      iVar18 = (p->vPages).nSize;
      uVar40 = p->iCur;
    }
    (p->vPages).nSize = iVar18 + 1;
    (p->vPages).pArray[iVar18] = pvVar33;
  }
  p->iCur = iVar37 + uVar40;
  puVar34 = (uint *)Mf_ManCutSet(p,uVar40);
  *puVar34 = nCuts;
  for (uVar32 = 0; uVar35 != uVar32; uVar32 = uVar32 + 1) {
    pMVar43 = pCutsR[uVar32];
    puVar34[1] = *(uint *)&pMVar43->field_0x10 << 5 | *(uint *)&pMVar43->field_0x10 >> 0x1b;
    memcpy(puVar34 + 2,pMVar43->pLeaves,(ulong)(*(uint *)&pMVar43->field_0x10 >> 0x19 & 0xfffffffc))
    ;
    puVar34 = puVar34 + 1 + (*(uint *)&pMVar43->field_0x10 >> 0x1b);
  }
  pMVar24->iCutSet = uVar40;
  if ((0 < (int)nCuts) && ((int)nCuts < (int)nCutNum)) {
    p->nCutCounts[*(uint *)&pCutsR[0]->field_0x10 >> 0x1b] =
         p->nCutCounts[*(uint *)&pCutsR[0]->field_0x10 >> 0x1b] + 1;
    p->CutCount[3] = (double)(int)nCuts + p->CutCount[3];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x45c,"void Mf_ObjMergeOrder(Mf_Man_t *, int)");
}

Assistant:

void Mf_ObjMergeOrder( Mf_Man_t * p, int iObj )
{
    Mf_Cut_t pCuts0[MF_CUT_MAX], pCuts1[MF_CUT_MAX], pCuts[MF_CUT_MAX], * pCutsR[MF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Mf_Obj_t * pBest = Mf_ManObj(p, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Mf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Mf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Mf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Mf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        int nCuts2  = Mf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Mf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Mf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 1000 == 0 )
//    if ( iObj == 474 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d\n", iObj, pBest->nFlowRefs, pBest->nMapRefs );
        for ( i = 0; i < nCutsR; i++ )
            Mf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // store the cutset
    pBest->Flow = pCutsR[0]->Flow;
    pBest->Delay = pCutsR[0]->Delay;
    pBest->iCutSet = Mf_ManSaveCuts( p, pCutsR, nCutsR );
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Mf_SetCheckArray(pCutsR, nCutsR) );
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
}